

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_oneof.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::objectivec::OneofGenerator::GenerateCaseEnum
          (OneofGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *buffer;
  pointer pcVar1;
  long lVar2;
  mapped_type *pmVar3;
  OneofDescriptor *pOVar4;
  char *pcVar5;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *field;
  long lVar6;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string enum_name;
  string field_name;
  key_type local_60;
  
  variables = &this->variables_;
  io::Printer::Print(printer,variables,"typedef GPB_ENUM($enum_name$) {\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,variables,"$enum_name$_GPBUnsetOneOfCase = 0,\n");
  buffer = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)buffer;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"enum_name","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_60);
  enum_name._M_dataplus._M_p = (pointer)&enum_name.field_2;
  pcVar1 = (pmVar3->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&enum_name,pcVar1,pcVar1 + pmVar3->_M_string_length);
  field = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != buffer) {
    operator_delete(local_60._M_dataplus._M_p);
    field = extraout_RDX_00;
  }
  pOVar4 = this->descriptor_;
  if (0 < *(int *)(pOVar4 + 4)) {
    lVar7 = 0;
    lVar6 = 0;
    do {
      lVar2 = *(long *)(pOVar4 + 0x20);
      FieldNameCapitalized_abi_cxx11_(&field_name,(objectivec *)(lVar7 + lVar2),field);
      local_60._M_dataplus._M_p = (pointer)buffer;
      pcVar5 = FastInt32ToBufferLeft(*(int32 *)(lVar2 + 4 + lVar7),buffer->_M_local_buf);
      local_60._M_string_length = (long)pcVar5 - (long)buffer;
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,local_60._M_dataplus._M_p,
                 local_60._M_dataplus._M_p + local_60._M_string_length);
      io::Printer::
      Print<char[10],std::__cxx11::string,char[11],std::__cxx11::string,char[13],std::__cxx11::string>
                (printer,"$enum_name$_$field_name$ = $field_number$,\n",(char (*) [10])"enum_name",
                 &enum_name,(char (*) [11])0x40a1f4,&field_name,(char (*) [13])"field_number",
                 &local_c0);
      field = extraout_RDX_01;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
        field = extraout_RDX_02;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)field_name._M_dataplus._M_p != &field_name.field_2) {
        operator_delete(field_name._M_dataplus._M_p);
        field = extraout_RDX_03;
      }
      lVar6 = lVar6 + 1;
      pOVar4 = this->descriptor_;
      lVar7 = lVar7 + 0x48;
    } while (lVar6 < *(int *)(pOVar4 + 4));
  }
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"};\n\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)enum_name._M_dataplus._M_p != &enum_name.field_2) {
    operator_delete(enum_name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void OneofGenerator::GenerateCaseEnum(io::Printer* printer) {
  printer->Print(
      variables_,
      "typedef GPB_ENUM($enum_name$) {\n");
  printer->Indent();
  printer->Print(
      variables_,
      "$enum_name$_GPBUnsetOneOfCase = 0,\n");
  std::string enum_name = variables_["enum_name"];
  for (int j = 0; j < descriptor_->field_count(); j++) {
    const FieldDescriptor* field = descriptor_->field(j);
    std::string field_name = FieldNameCapitalized(field);
    printer->Print(
        "$enum_name$_$field_name$ = $field_number$,\n",
        "enum_name", enum_name,
        "field_name", field_name,
        "field_number", StrCat(field->number()));
  }
  printer->Outdent();
  printer->Print(
      "};\n"
      "\n");
}